

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O2

StencilOp vkt::pipeline::mapVkStencilOp(VkStencilOp stencilOp)

{
  if (stencilOp < VK_STENCIL_OP_LAST) {
    return *(StencilOp *)(&DAT_00983484 + (ulong)stencilOp * 4);
  }
  return STENCILOP_LAST;
}

Assistant:

rr::StencilOp mapVkStencilOp (vk::VkStencilOp stencilOp)
{
	switch (stencilOp)
	{
		case VK_STENCIL_OP_KEEP:					return rr::STENCILOP_KEEP;
		case VK_STENCIL_OP_ZERO:					return rr::STENCILOP_ZERO;
		case VK_STENCIL_OP_REPLACE:					return rr::STENCILOP_REPLACE;
		case VK_STENCIL_OP_INCREMENT_AND_CLAMP:		return rr::STENCILOP_INCR;
		case VK_STENCIL_OP_DECREMENT_AND_CLAMP:		return rr::STENCILOP_DECR;
		case VK_STENCIL_OP_INVERT:					return rr::STENCILOP_INVERT;
		case VK_STENCIL_OP_INCREMENT_AND_WRAP:		return rr::STENCILOP_INCR_WRAP;
		case VK_STENCIL_OP_DECREMENT_AND_WRAP:		return rr::STENCILOP_DECR_WRAP;
		default:
			DE_ASSERT(false);
	}
	return rr::STENCILOP_LAST;
}